

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O0

void __thiscall cfd::core::TapBranch::AddBranch(TapBranch *this,ByteData256 *commitment)

{
  size_type sVar1;
  undefined8 uVar2;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  undefined4 in_stack_ffffffffffffffb4;
  CfdError in_stack_ffffffffffffffbc;
  CfdException *in_stack_ffffffffffffffc0;
  string local_38 [32];
  ByteData256 *local_18;
  ByteData256 *commitment_local;
  TapBranch *this_local;
  
  local_18 = commitment;
  commitment_local = (ByteData256 *)this;
  ::std::vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>>::
  emplace_back<cfd::core::ByteData256_const&>
            ((vector<cfd::core::TapBranch,std::allocator<cfd::core::TapBranch>> *)
             &this->branch_list_,commitment);
  sVar1 = ::std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::size
                    (&this->branch_list_);
  if (0x80 < sVar1) {
    uVar3 = CONCAT13(1,(int3)in_stack_ffffffffffffffb0);
    uVar2 = __cxa_allocate_exception(0x30);
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              (local_38,"tapbranch maximum over.",(allocator *)&stack0xffffffffffffffc7);
    CfdException::CfdException
              (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
               (string *)CONCAT44(in_stack_ffffffffffffffb4,uVar3));
    __cxa_throw(uVar2,&CfdException::typeinfo,CfdException::~CfdException);
  }
  return;
}

Assistant:

void TapBranch::AddBranch(const ByteData256& commitment) {
  branch_list_.emplace_back(commitment);
  if (branch_list_.size() > TaprootScriptTree::kTaprootControlMaxNodeCount) {
    throw CfdException(
        CfdError::kCfdIllegalStateError, "tapbranch maximum over.");
  }
}